

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_random_round_trip.cpp
# Opt level: O3

void __thiscall randomRoundTrip_basic_Test::TestBody(randomRoundTrip_basic_Test *this)

{
  ulong uVar1;
  precise_unit *un;
  uint64_t match_flags;
  char *message;
  int iVar2;
  precise_unit pVar3;
  unit startunit;
  string str;
  unit resunit;
  default_random_engine engine;
  uniform_int_distribution<unsigned_int> distribution;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  double local_a8;
  unit_data local_a0;
  undefined4 uStack_9c;
  unit local_98;
  string local_90;
  AssertHelper local_70;
  unit local_68;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_60;
  string local_58;
  param_type local_38;
  
  uVar1 = std::chrono::_V2::system_clock::now();
  local_60._M_x = uVar1 % 0x7fffffff + (ulong)(uVar1 % 0x7fffffff == 0);
  local_38._M_a = 0;
  local_38._M_b = 0xffffffff;
  iVar2 = 6000;
  do {
    local_98.base_units_ =
         (unit_data)
         std::uniform_int_distribution<unsigned_int>::operator()
                   ((uniform_int_distribution<unsigned_int> *)&local_38,&local_60,&local_38);
    local_98.multiplier_ = 1.0;
    un = (precise_unit *)units::getDefaultFlags();
    local_a8 = (double)local_98.multiplier_;
    local_a0 = local_98.base_units_;
    uStack_9c = 0;
    units::to_string_abi_cxx11_(&local_90,(units *)&local_a8,un,(ulong)(uint)local_98.base_units_);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    match_flags = units::getDefaultFlags();
    pVar3 = units::unit_from_string(&local_58,match_flags);
    local_68 = (unit)((ulong)(uint)(float)pVar3.multiplier_ | pVar3._8_8_ << 0x20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    testing::internal::CmpHelperEQ<units::unit,units::unit>
              ((internal *)&local_a8,"startunit","resunit",&local_98,&local_68);
    if (local_a8._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_b0._M_head_impl + 0x10),"round trip failed ",0x12);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_b0._M_head_impl + 0x10));
      message = "";
      if ((undefined8 *)CONCAT44(uStack_9c,local_a0) != (undefined8 *)0x0) {
        message = *(char **)CONCAT44(uStack_9c,local_a0);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_random_round_trip.cpp"
                 ,0x23,message);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_9c,local_a0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_9c,local_a0));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

TEST(randomRoundTrip, basic)
{
    if (sizeof(UNITS_BASE_TYPE) == 4) {
        std::default_random_engine engine(
            std::chrono::system_clock::now().time_since_epoch().count());
        std::uniform_int_distribution<unsigned int> distribution(
            0, std::numeric_limits<unsigned int>::max());

        for (auto ii = 0; ii < 6000; ++ii) {
            auto start = distribution(engine);
            detail::unit_data unitdata(nullptr);
            memcpy(static_cast<void*>(&unitdata), &start, 4);
            auto startunit = unit(unitdata);
            auto str = to_string(startunit);
            auto resunit = unit_cast(unit_from_string(str));
            EXPECT_EQ(startunit, resunit) << "round trip failed " << start;
        }
    }
}